

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::CompileShader
          (ShaderImageLoadStoreBase *this,GLuint shader)

{
  CallLogWrapper *this_00;
  GLsizei length;
  GLint status;
  GLchar log [1024];
  int local_430;
  int local_42c;
  GLchar local_428 [1032];
  
  this_00 = &(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glCompileShader(this_00,shader);
  glu::CallLogWrapper::glGetShaderiv(this_00,shader,0x8b81,&local_42c);
  if (local_42c == 0) {
    glu::CallLogWrapper::glGetShaderInfoLog(this_00,shader,0x400,&local_430,local_428);
    if (1 < local_430) {
      anon_unknown_0::Output("Shader Info Log:\n%s\n",local_428);
    }
  }
  return local_42c != 0;
}

Assistant:

bool CompileShader(GLuint shader)
	{
		glCompileShader(shader);

		GLint status;
		glGetShaderiv(shader, GL_COMPILE_STATUS, &status);
		if (status == GL_FALSE)
		{
			GLsizei length;
			GLchar  log[1024];
			glGetShaderInfoLog(shader, sizeof(log), &length, log);
			if (length > 1)
			{
				Output("Shader Info Log:\n%s\n", log);
			}
			return false;
		}
		return true;
	}